

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int luaG_getfuncline(Proto *f,int pc)

{
  AbsLineInfo *pAVar1;
  AbsLineInfo *pAVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  
  if (f->lineinfo == (ls_byte *)0x0) {
    return -1;
  }
  iVar4 = f->sizeabslineinfo;
  lVar5 = (long)iVar4;
  if ((lVar5 == 0) || (pAVar2 = f->abslineinfo, pc < pAVar2->pc)) {
    piVar7 = &f->linedefined;
    iVar4 = -1;
  }
  else {
    iVar3 = pc + 0x7f;
    if (-1 < pc) {
      iVar3 = pc;
    }
    iVar3 = iVar3 >> 7;
    lVar8 = (long)iVar3;
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
    lVar6 = (long)(iVar3 + -1);
    lVar9 = (lVar8 << 0x20) + -0x200000000;
    if (lVar5 <= lVar8) {
      lVar5 = lVar8;
    }
    do {
      if (lVar5 == lVar8) goto LAB_00109f38;
      lVar9 = lVar9 + 0x100000000;
      pAVar1 = pAVar2 + lVar8;
      lVar8 = lVar8 + 1;
    } while (pAVar1->pc <= pc);
    lVar6 = lVar9 >> 0x20;
LAB_00109f38:
    piVar7 = &pAVar2[lVar6].line;
    iVar4 = pAVar2[lVar6].pc;
  }
  iVar3 = *piVar7;
  if (iVar4 < pc) {
    lVar5 = (long)iVar4;
    do {
      lVar8 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      iVar3 = iVar3 + f->lineinfo[lVar8];
    } while (pc != lVar5);
  }
  return iVar3;
}

Assistant:

int luaG_getfuncline (const Proto *f, int pc) {
  if (f->lineinfo == NULL)  /* no debug information? */
    return -1;
  else {
    int basepc;
    int baseline = getbaseline(f, pc, &basepc);
    while (basepc++ < pc) {  /* walk until given instruction */
      lua_assert(f->lineinfo[basepc] != ABSLINEINFO);
      baseline += f->lineinfo[basepc];  /* correct line */
    }
    return baseline;
  }
}